

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct16x16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar19;
  int iVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  int iVar32;
  int iVar33;
  undefined1 auVar31 [16];
  int iVar34;
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar39;
  int iVar42;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  int iVar48;
  int iVar49;
  undefined1 auVar47 [16];
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar60;
  int iVar61;
  int iVar62;
  uint uVar63;
  int iVar64;
  int iVar66;
  uint uVar67;
  int iVar68;
  int iVar69;
  uint uVar70;
  int iVar71;
  undefined1 auVar65 [16];
  int iVar72;
  uint uVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  uint uVar88;
  int iVar90;
  int iVar91;
  uint uVar92;
  int iVar93;
  int iVar94;
  uint uVar95;
  undefined1 auVar89 [16];
  int iVar96;
  int iVar97;
  int iVar98;
  uint uVar99;
  int iVar100;
  uint uVar101;
  int iVar102;
  int iVar107;
  int iVar110;
  undefined1 auVar103 [16];
  uint uVar108;
  uint uVar111;
  int iVar113;
  uint uVar114;
  undefined1 auVar104 [16];
  int iVar109;
  int iVar112;
  int iVar115;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar116;
  int iVar122;
  int iVar123;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  int iVar124;
  undefined1 auVar121 [16];
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  undefined1 local_108 [16];
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  lVar6 = (long)bit * 0x100;
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x170);
  iVar9 = -iVar23;
  iVar26 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x1f0);
  iVar7 = -iVar26;
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x1b0);
  iVar10 = -iVar4;
  iVar8 = 1 << ((char)bit - 1U & 0x1f);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x230);
  iVar3 = -iVar5;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x250);
  auVar119._4_4_ = uVar1;
  auVar119._0_4_ = uVar1;
  auVar119._8_4_ = uVar1;
  auVar119._12_4_ = uVar1;
  auVar11._4_4_ = iVar9;
  auVar11._0_4_ = iVar9;
  auVar11._8_4_ = iVar9;
  auVar11._12_4_ = iVar9;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x1d0);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar36._4_4_ = iVar7;
  auVar36._0_4_ = iVar7;
  auVar36._8_4_ = iVar7;
  auVar36._12_4_ = iVar7;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x210);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar47._4_4_ = iVar4;
  auVar47._0_4_ = iVar4;
  auVar47._8_4_ = iVar4;
  auVar47._12_4_ = iVar4;
  auVar44._4_4_ = iVar10;
  auVar44._0_4_ = iVar10;
  auVar44._8_4_ = iVar10;
  auVar44._12_4_ = iVar10;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 400);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar41._4_4_ = iVar26;
  auVar41._0_4_ = iVar26;
  auVar41._8_4_ = iVar26;
  auVar41._12_4_ = iVar26;
  auVar18._4_4_ = iVar23;
  auVar18._0_4_ = iVar23;
  auVar18._8_4_ = iVar23;
  auVar18._12_4_ = iVar23;
  auVar24 = pmulld(auVar18,(undefined1  [16])in[1]);
  auVar103 = pmulld((undefined1  [16])in[1],auVar119);
  auVar16 = pmulld(auVar11,(undefined1  [16])in[0xf]);
  auVar53 = pmulld(auVar41,(undefined1  [16])in[9]);
  auVar65 = pmulld((undefined1  [16])in[9],auVar37);
  auVar40 = pmulld(auVar36,(undefined1  [16])in[7]);
  auVar89 = pmulld(auVar47,(undefined1  [16])in[5]);
  auVar41 = pmulld((undefined1  [16])in[5],auVar28);
  auVar77 = pmulld(auVar44,(undefined1  [16])in[0xb]);
  auVar78._4_4_ = iVar3;
  auVar78._0_4_ = iVar3;
  auVar78._8_4_ = iVar3;
  auVar78._12_4_ = iVar3;
  auVar17._4_4_ = iVar5;
  auVar17._0_4_ = iVar5;
  auVar17._8_4_ = iVar5;
  auVar17._12_4_ = iVar5;
  auVar17 = pmulld(auVar17,(undefined1  [16])in[0xd]);
  auVar47 = pmulld((undefined1  [16])in[0xd],auVar31);
  auVar78 = pmulld(auVar78,(undefined1  [16])in[3]);
  auVar11 = pmulld((undefined1  [16])in[3],auVar31);
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x180);
  iVar4 = -iVar23;
  auVar117 = pmulld((undefined1  [16])in[0xb],auVar28);
  iVar26 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x200);
  iVar5 = -iVar26;
  auVar25 = pmulld((undefined1  [16])in[7],auVar37);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x240);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar118._4_4_ = iVar4;
  auVar118._0_4_ = iVar4;
  auVar118._8_4_ = iVar4;
  auVar118._12_4_ = iVar4;
  auVar79._4_4_ = iVar23;
  auVar79._0_4_ = iVar23;
  auVar79._8_4_ = iVar23;
  auVar79._12_4_ = iVar23;
  auVar36 = pmulld((undefined1  [16])in[0xf],auVar119);
  local_148 = auVar24._0_4_;
  iStack_144 = auVar24._4_4_;
  iStack_140 = auVar24._8_4_;
  iStack_13c = auVar24._12_4_;
  auVar79 = pmulld(auVar79,(undefined1  [16])in[2]);
  auVar31 = pmulld((undefined1  [16])in[2],auVar54);
  auVar119 = pmulld(auVar118,(undefined1  [16])in[0xe]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x1c0);
  auVar120._4_4_ = uVar1;
  auVar120._0_4_ = uVar1;
  auVar120._8_4_ = uVar1;
  auVar120._12_4_ = uVar1;
  auVar24._4_4_ = iVar5;
  auVar24._0_4_ = iVar5;
  auVar24._8_4_ = iVar5;
  auVar24._12_4_ = iVar5;
  auVar35._4_4_ = iVar26;
  auVar35._0_4_ = iVar26;
  auVar35._8_4_ = iVar26;
  auVar35._12_4_ = iVar26;
  auVar37 = pmulld(auVar35,(undefined1  [16])in[10]);
  auVar28 = pmulld((undefined1  [16])in[10],auVar120);
  auVar24 = pmulld(auVar24,(undefined1  [16])in[6]);
  auVar35 = pmulld((undefined1  [16])in[6],auVar120);
  auVar44 = ZEXT416((uint)bit);
  auVar18 = pmulld((undefined1  [16])in[0xe],auVar54);
  local_108._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x1e0);
  iVar100 = auVar103._0_4_ + iVar8 + auVar16._0_4_ >> auVar44;
  iVar107 = auVar103._4_4_ + iVar8 + auVar16._4_4_ >> auVar44;
  iVar110 = auVar103._8_4_ + iVar8 + auVar16._8_4_ >> auVar44;
  iVar113 = auVar103._12_4_ + iVar8 + auVar16._12_4_ >> auVar44;
  iVar3 = auVar65._0_4_ + iVar8 + auVar40._0_4_ >> auVar44;
  iVar66 = auVar65._4_4_ + iVar8 + auVar40._4_4_ >> auVar44;
  iVar69 = auVar65._8_4_ + iVar8 + auVar40._8_4_ >> auVar44;
  iVar72 = auVar65._12_4_ + iVar8 + auVar40._12_4_ >> auVar44;
  iVar7 = auVar41._0_4_ + iVar8 + auVar77._0_4_ >> auVar44;
  iVar9 = auVar41._4_4_ + iVar8 + auVar77._4_4_ >> auVar44;
  iVar42 = auVar41._8_4_ + iVar8 + auVar77._8_4_ >> auVar44;
  iVar43 = auVar41._12_4_ + iVar8 + auVar77._12_4_ >> auVar44;
  iVar46 = auVar47._0_4_ + iVar8 + auVar78._0_4_ >> auVar44;
  iVar48 = auVar47._4_4_ + iVar8 + auVar78._4_4_ >> auVar44;
  iVar49 = auVar47._8_4_ + iVar8 + auVar78._8_4_ >> auVar44;
  iVar50 = auVar47._12_4_ + iVar8 + auVar78._12_4_ >> auVar44;
  iVar51 = auVar17._0_4_ + iVar8 + auVar11._0_4_ >> auVar44;
  iVar55 = auVar17._4_4_ + iVar8 + auVar11._4_4_ >> auVar44;
  iVar57 = auVar17._8_4_ + iVar8 + auVar11._8_4_ >> auVar44;
  iVar60 = auVar17._12_4_ + iVar8 + auVar11._12_4_ >> auVar44;
  iVar86 = auVar89._0_4_ + iVar8 + auVar117._0_4_ >> auVar44;
  iVar90 = auVar89._4_4_ + iVar8 + auVar117._4_4_ >> auVar44;
  iVar93 = auVar89._8_4_ + iVar8 + auVar117._8_4_ >> auVar44;
  iVar96 = auVar89._12_4_ + iVar8 + auVar117._12_4_ >> auVar44;
  iVar23 = auVar53._0_4_ + iVar8 + auVar25._0_4_ >> auVar44;
  iVar26 = auVar53._4_4_ + iVar8 + auVar25._4_4_ >> auVar44;
  iVar4 = auVar53._8_4_ + iVar8 + auVar25._8_4_ >> auVar44;
  iVar27 = auVar53._12_4_ + iVar8 + auVar25._12_4_ >> auVar44;
  local_108._0_4_ = local_108._4_4_;
  local_108._8_4_ = local_108._4_4_;
  local_108._12_4_ = local_108._4_4_;
  iVar87 = local_148 + iVar8 + auVar36._0_4_ >> auVar44;
  iVar91 = iStack_144 + iVar8 + auVar36._4_4_ >> auVar44;
  iVar94 = iStack_140 + iVar8 + auVar36._8_4_ >> auVar44;
  iVar97 = iStack_13c + iVar8 + auVar36._12_4_ >> auVar44;
  iVar5 = iVar3 + iVar100;
  iVar10 = iVar66 + iVar107;
  iVar12 = iVar69 + iVar110;
  iVar13 = iVar72 + iVar113;
  iVar100 = iVar100 - iVar3;
  iVar107 = iVar107 - iVar66;
  iVar110 = iVar110 - iVar69;
  iVar113 = iVar113 - iVar72;
  iVar3 = iVar46 + iVar7;
  iVar66 = iVar48 + iVar9;
  iVar69 = iVar49 + iVar42;
  iVar14 = iVar50 + iVar43;
  iVar46 = iVar46 - iVar7;
  iVar48 = iVar48 - iVar9;
  iVar49 = iVar49 - iVar42;
  iVar50 = iVar50 - iVar43;
  iVar7 = iVar86 + iVar51;
  iVar42 = iVar90 + iVar55;
  iVar72 = iVar93 + iVar57;
  iVar15 = iVar96 + iVar60;
  iVar51 = iVar51 - iVar86;
  iVar55 = iVar55 - iVar90;
  iVar57 = iVar57 - iVar93;
  iVar60 = iVar60 - iVar96;
  iVar9 = iVar87 + iVar23;
  iVar43 = iVar91 + iVar26;
  iVar86 = iVar94 + iVar4;
  iVar90 = iVar97 + iVar27;
  iVar87 = iVar87 - iVar23;
  iVar91 = iVar91 - iVar26;
  iVar94 = iVar94 - iVar4;
  iVar97 = iVar97 - iVar27;
  auVar16 = pmulld((undefined1  [16])*in,local_108);
  auVar11 = pmulld((undefined1  [16])in[8],local_108);
  iVar52 = auVar16._0_4_ + iVar8;
  iVar56 = auVar16._4_4_ + iVar8;
  iVar58 = auVar16._8_4_ + iVar8;
  iVar61 = auVar16._12_4_ + iVar8;
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x220);
  iVar26 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x1a0);
  iVar4 = -iVar26;
  auVar40._4_4_ = iVar23;
  auVar40._0_4_ = iVar23;
  auVar40._8_4_ = iVar23;
  auVar40._12_4_ = iVar23;
  auVar16._4_4_ = iVar4;
  auVar16._0_4_ = iVar4;
  auVar16._8_4_ = iVar4;
  auVar16._12_4_ = iVar4;
  auVar36 = pmulld((undefined1  [16])in[4],auVar40);
  auVar41 = pmulld((undefined1  [16])in[0xc],auVar16);
  iVar30 = auVar31._0_4_ + iVar8 + auVar119._0_4_ >> auVar44;
  iVar32 = auVar31._4_4_ + iVar8 + auVar119._4_4_ >> auVar44;
  iVar33 = auVar31._8_4_ + iVar8 + auVar119._8_4_ >> auVar44;
  iVar34 = auVar31._12_4_ + iVar8 + auVar119._12_4_ >> auVar44;
  auVar25._4_4_ = iVar26;
  auVar25._0_4_ = iVar26;
  auVar25._8_4_ = iVar26;
  auVar25._12_4_ = iVar26;
  auVar31 = pmulld((undefined1  [16])in[4],auVar25);
  auVar17 = pmulld((undefined1  [16])in[0xc],auVar40);
  iVar26 = auVar28._0_4_ + iVar8 + auVar24._0_4_ >> auVar44;
  iVar4 = auVar28._4_4_ + iVar8 + auVar24._4_4_ >> auVar44;
  iVar93 = auVar28._8_4_ + iVar8 + auVar24._8_4_ >> auVar44;
  iVar29 = auVar28._12_4_ + iVar8 + auVar24._12_4_ >> auVar44;
  iVar27 = iVar26 + iVar30;
  iVar96 = iVar4 + iVar32;
  iVar19 = iVar93 + iVar33;
  iVar21 = iVar29 + iVar34;
  iVar30 = iVar30 - iVar26;
  iVar32 = iVar32 - iVar4;
  iVar33 = iVar33 - iVar93;
  iVar34 = iVar34 - iVar29;
  iVar26 = auVar37._0_4_ + iVar8 + auVar35._0_4_ >> auVar44;
  iVar4 = auVar37._4_4_ + iVar8 + auVar35._4_4_ >> auVar44;
  iVar38 = auVar37._8_4_ + iVar8 + auVar35._8_4_ >> auVar44;
  iVar39 = auVar37._12_4_ + iVar8 + auVar35._12_4_ >> auVar44;
  iVar75 = auVar79._0_4_ + iVar8 + auVar18._0_4_ >> auVar44;
  iVar80 = auVar79._4_4_ + iVar8 + auVar18._4_4_ >> auVar44;
  iVar82 = auVar79._8_4_ + iVar8 + auVar18._8_4_ >> auVar44;
  iVar84 = auVar79._12_4_ + iVar8 + auVar18._12_4_ >> auVar44;
  iVar93 = iVar75 + iVar26;
  iVar29 = iVar80 + iVar4;
  iVar20 = iVar82 + iVar38;
  iVar22 = iVar84 + iVar39;
  iVar75 = iVar75 - iVar26;
  iVar80 = iVar80 - iVar4;
  iVar82 = iVar82 - iVar38;
  iVar84 = iVar84 - iVar39;
  iVar23 = -iVar23;
  iVar4 = bd + (uint)(do_cols == 0) * 2;
  iVar26 = 0x8000;
  if (0xf < iVar4 + 6) {
    iVar26 = 1 << ((char)iVar4 + 5U & 0x1f);
  }
  iVar4 = -iVar26;
  iVar26 = iVar26 + -1;
  uVar101 = (uint)(iVar100 < iVar4) * iVar4 | (uint)(iVar100 >= iVar4) * iVar100;
  uVar108 = (uint)(iVar107 < iVar4) * iVar4 | (uint)(iVar107 >= iVar4) * iVar107;
  uVar111 = (uint)(iVar110 < iVar4) * iVar4 | (uint)(iVar110 >= iVar4) * iVar110;
  uVar114 = (uint)(iVar113 < iVar4) * iVar4 | (uint)(iVar113 >= iVar4) * iVar113;
  auVar104._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar104._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar104._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar104._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar87 < iVar4) * iVar4 | (uint)(iVar87 >= iVar4) * iVar87;
  uVar108 = (uint)(iVar91 < iVar4) * iVar4 | (uint)(iVar91 >= iVar4) * iVar91;
  uVar111 = (uint)(iVar94 < iVar4) * iVar4 | (uint)(iVar94 >= iVar4) * iVar94;
  uVar114 = (uint)(iVar97 < iVar4) * iVar4 | (uint)(iVar97 >= iVar4) * iVar97;
  auVar77._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar77._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar77._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar77._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  auVar47 = pmulld(auVar104,auVar16);
  auVar18 = pmulld(auVar77,auVar40);
  auVar89._4_4_ = iVar23;
  auVar89._0_4_ = iVar23;
  auVar89._8_4_ = iVar23;
  auVar89._12_4_ = iVar23;
  uVar101 = (uint)(iVar46 < iVar4) * iVar4 | (uint)(iVar46 >= iVar4) * iVar46;
  uVar108 = (uint)(iVar48 < iVar4) * iVar4 | (uint)(iVar48 >= iVar4) * iVar48;
  uVar111 = (uint)(iVar49 < iVar4) * iVar4 | (uint)(iVar49 >= iVar4) * iVar49;
  uVar114 = (uint)(iVar50 < iVar4) * iVar4 | (uint)(iVar50 >= iVar4) * iVar50;
  auVar53._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar53._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar53._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar53._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar51 < iVar4) * iVar4 | (uint)(iVar51 >= iVar4) * iVar51;
  uVar108 = (uint)(iVar55 < iVar4) * iVar4 | (uint)(iVar55 >= iVar4) * iVar55;
  uVar111 = (uint)(iVar57 < iVar4) * iVar4 | (uint)(iVar57 >= iVar4) * iVar57;
  uVar114 = (uint)(iVar60 < iVar4) * iVar4 | (uint)(iVar60 >= iVar4) * iVar60;
  auVar117._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar117._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar117._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar117._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  auVar28 = pmulld(auVar89,auVar53);
  auVar37 = pmulld(auVar117,auVar16);
  auVar24 = pmulld(auVar53,auVar16);
  auVar35 = pmulld(auVar117,auVar40);
  auVar40 = pmulld(auVar104,auVar40);
  auVar16 = pmulld(auVar77,auVar25);
  iVar49 = iVar52 + auVar11._0_4_ >> auVar44;
  iVar50 = iVar56 + auVar11._4_4_ >> auVar44;
  iVar87 = iVar58 + auVar11._8_4_ >> auVar44;
  iVar97 = iVar61 + auVar11._12_4_ >> auVar44;
  iVar113 = iVar52 - auVar11._0_4_ >> auVar44;
  iVar56 = iVar56 - auVar11._4_4_ >> auVar44;
  iVar59 = iVar58 - auVar11._8_4_ >> auVar44;
  iVar62 = iVar61 - auVar11._12_4_ >> auVar44;
  iVar60 = auVar31._0_4_ + iVar8 + auVar17._0_4_ >> auVar44;
  iVar38 = auVar31._4_4_ + iVar8 + auVar17._4_4_ >> auVar44;
  iVar39 = auVar31._8_4_ + iVar8 + auVar17._8_4_ >> auVar44;
  iVar46 = auVar31._12_4_ + iVar8 + auVar17._12_4_ >> auVar44;
  iVar23 = iVar60 + iVar49;
  iVar51 = iVar38 + iVar50;
  iVar55 = iVar39 + iVar87;
  iVar57 = iVar46 + iVar97;
  iVar49 = iVar49 - iVar60;
  iVar50 = iVar50 - iVar38;
  iVar87 = iVar87 - iVar39;
  iVar97 = iVar97 - iVar46;
  iVar60 = auVar36._0_4_ + iVar8 + auVar41._0_4_ >> auVar44;
  iVar38 = auVar36._4_4_ + iVar8 + auVar41._4_4_ >> auVar44;
  iVar39 = auVar36._8_4_ + iVar8 + auVar41._8_4_ >> auVar44;
  iVar46 = auVar36._12_4_ + iVar8 + auVar41._12_4_ >> auVar44;
  iVar48 = iVar60 + iVar113;
  iVar52 = iVar38 + iVar56;
  iVar61 = iVar39 + iVar59;
  iVar98 = iVar46 + iVar62;
  iVar113 = iVar113 - iVar60;
  iVar56 = iVar56 - iVar38;
  iVar59 = iVar59 - iVar39;
  iVar62 = iVar62 - iVar46;
  uVar101 = (uint)(iVar30 < iVar4) * iVar4 | (uint)(iVar30 >= iVar4) * iVar30;
  uVar108 = (uint)(iVar32 < iVar4) * iVar4 | (uint)(iVar32 >= iVar4) * iVar32;
  uVar111 = (uint)(iVar33 < iVar4) * iVar4 | (uint)(iVar33 >= iVar4) * iVar33;
  uVar114 = (uint)(iVar34 < iVar4) * iVar4 | (uint)(iVar34 >= iVar4) * iVar34;
  auVar103._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar103._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar103._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar103._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar75 < iVar4) * iVar4 | (uint)(iVar75 >= iVar4) * iVar75;
  uVar108 = (uint)(iVar80 < iVar4) * iVar4 | (uint)(iVar80 >= iVar4) * iVar80;
  uVar111 = (uint)(iVar82 < iVar4) * iVar4 | (uint)(iVar82 >= iVar4) * iVar82;
  uVar114 = (uint)(iVar84 < iVar4) * iVar4 | (uint)(iVar84 >= iVar4) * iVar84;
  auVar65._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar65._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar65._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar65._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  auVar11 = pmulld(auVar103,local_108);
  auVar17 = pmulld(auVar65,local_108);
  uVar101 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar108 = (uint)(iVar10 < iVar4) * iVar4 | (uint)(iVar10 >= iVar4) * iVar10;
  uVar111 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  uVar114 = (uint)(iVar13 < iVar4) * iVar4 | (uint)(iVar13 >= iVar4) * iVar13;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar63 = (uint)(iVar3 < iVar4) * iVar4 | (uint)(iVar3 >= iVar4) * iVar3;
  uVar67 = (uint)(iVar66 < iVar4) * iVar4 | (uint)(iVar66 >= iVar4) * iVar66;
  uVar70 = (uint)(iVar69 < iVar4) * iVar4 | (uint)(iVar69 >= iVar4) * iVar69;
  uVar73 = (uint)(iVar14 < iVar4) * iVar4 | (uint)(iVar14 >= iVar4) * iVar14;
  uVar63 = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  uVar67 = (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  uVar70 = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
  uVar73 = (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  iVar91 = uVar63 + uVar101;
  iVar94 = uVar67 + uVar108;
  iVar100 = uVar70 + uVar111;
  iVar110 = uVar73 + uVar114;
  iVar5 = uVar101 - uVar63;
  iVar10 = uVar108 - uVar67;
  iVar12 = uVar111 - uVar70;
  iVar13 = uVar114 - uVar73;
  iVar116 = auVar47._0_4_ + iVar8 + auVar18._0_4_ >> auVar44;
  iVar122 = auVar47._4_4_ + iVar8 + auVar18._4_4_ >> auVar44;
  iVar123 = auVar47._8_4_ + iVar8 + auVar18._8_4_ >> auVar44;
  iVar124 = auVar47._12_4_ + iVar8 + auVar18._12_4_ >> auVar44;
  iVar30 = auVar28._0_4_ + iVar8 + auVar37._0_4_ >> auVar44;
  iVar32 = auVar28._4_4_ + iVar8 + auVar37._4_4_ >> auVar44;
  iVar33 = auVar28._8_4_ + iVar8 + auVar37._8_4_ >> auVar44;
  iVar34 = auVar28._12_4_ + iVar8 + auVar37._12_4_ >> auVar44;
  iVar3 = iVar30 + iVar116;
  iVar66 = iVar32 + iVar122;
  iVar69 = iVar33 + iVar123;
  iVar14 = iVar34 + iVar124;
  iVar116 = iVar116 - iVar30;
  iVar122 = iVar122 - iVar32;
  iVar123 = iVar123 - iVar33;
  iVar124 = iVar124 - iVar34;
  uVar101 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar108 = (uint)(iVar42 < iVar4) * iVar4 | (uint)(iVar42 >= iVar4) * iVar42;
  uVar111 = (uint)(iVar72 < iVar4) * iVar4 | (uint)(iVar72 >= iVar4) * iVar72;
  uVar114 = (uint)(iVar15 < iVar4) * iVar4 | (uint)(iVar15 >= iVar4) * iVar15;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar63 = (uint)(iVar9 < iVar4) * iVar4 | (uint)(iVar9 >= iVar4) * iVar9;
  uVar67 = (uint)(iVar43 < iVar4) * iVar4 | (uint)(iVar43 >= iVar4) * iVar43;
  uVar70 = (uint)(iVar86 < iVar4) * iVar4 | (uint)(iVar86 >= iVar4) * iVar86;
  uVar73 = (uint)(iVar90 < iVar4) * iVar4 | (uint)(iVar90 >= iVar4) * iVar90;
  uVar63 = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  uVar67 = (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  uVar70 = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
  uVar73 = (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  iVar64 = uVar63 + uVar101;
  iVar68 = uVar67 + uVar108;
  iVar71 = uVar70 + uVar111;
  iVar74 = uVar73 + uVar114;
  iVar33 = uVar63 - uVar101;
  iVar58 = uVar67 - uVar108;
  iVar80 = uVar70 - uVar111;
  iVar107 = uVar73 - uVar114;
  iVar42 = auVar24._0_4_ + iVar8 + auVar35._0_4_ >> auVar44;
  iVar72 = auVar24._4_4_ + iVar8 + auVar35._4_4_ >> auVar44;
  iVar15 = auVar24._8_4_ + iVar8 + auVar35._8_4_ >> auVar44;
  iVar90 = auVar24._12_4_ + iVar8 + auVar35._12_4_ >> auVar44;
  iVar102 = auVar40._0_4_ + iVar8 + auVar16._0_4_ >> auVar44;
  iVar109 = auVar40._4_4_ + iVar8 + auVar16._4_4_ >> auVar44;
  iVar112 = auVar40._8_4_ + iVar8 + auVar16._8_4_ >> auVar44;
  iVar115 = auVar40._12_4_ + iVar8 + auVar16._12_4_ >> auVar44;
  iVar7 = iVar102 + iVar42;
  iVar9 = iVar109 + iVar72;
  iVar43 = iVar112 + iVar15;
  iVar86 = iVar115 + iVar90;
  iVar102 = iVar102 - iVar42;
  iVar109 = iVar109 - iVar72;
  iVar112 = iVar112 - iVar15;
  iVar115 = iVar115 - iVar90;
  uVar101 = (uint)(iVar93 < iVar4) * iVar4 | (uint)(iVar93 >= iVar4) * iVar93;
  uVar108 = (uint)(iVar29 < iVar4) * iVar4 | (uint)(iVar29 >= iVar4) * iVar29;
  uVar111 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  uVar114 = (uint)(iVar22 < iVar4) * iVar4 | (uint)(iVar22 >= iVar4) * iVar22;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar63 = (uint)(iVar23 < iVar4) * iVar4 | (uint)(iVar23 >= iVar4) * iVar23;
  uVar67 = (uint)(iVar51 < iVar4) * iVar4 | (uint)(iVar51 >= iVar4) * iVar51;
  uVar70 = (uint)(iVar55 < iVar4) * iVar4 | (uint)(iVar55 >= iVar4) * iVar55;
  uVar73 = (uint)(iVar57 < iVar4) * iVar4 | (uint)(iVar57 >= iVar4) * iVar57;
  uVar63 = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  uVar67 = (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  uVar70 = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
  uVar73 = (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  iVar60 = uVar63 + uVar101;
  iVar38 = uVar67 + uVar108;
  iVar39 = uVar70 + uVar111;
  iVar46 = uVar73 + uVar114;
  iVar34 = uVar63 - uVar101;
  iVar51 = uVar67 - uVar108;
  iVar55 = uVar70 - uVar111;
  iVar57 = uVar73 - uVar114;
  uVar101 = (uint)(iVar48 < iVar4) * iVar4 | (uint)(iVar48 >= iVar4) * iVar48;
  uVar108 = (uint)(iVar52 < iVar4) * iVar4 | (uint)(iVar52 >= iVar4) * iVar52;
  uVar111 = (uint)(iVar61 < iVar4) * iVar4 | (uint)(iVar61 >= iVar4) * iVar61;
  uVar114 = (uint)(iVar98 < iVar4) * iVar4 | (uint)(iVar98 >= iVar4) * iVar98;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  iVar48 = auVar11._0_4_ + iVar8 + auVar17._0_4_ >> auVar44;
  iVar52 = auVar11._4_4_ + iVar8 + auVar17._4_4_ >> auVar44;
  iVar61 = auVar11._8_4_ + iVar8 + auVar17._8_4_ >> auVar44;
  iVar82 = auVar11._12_4_ + iVar8 + auVar17._12_4_ >> auVar44;
  iVar76 = iVar48 + uVar101;
  iVar81 = iVar52 + uVar108;
  iVar83 = iVar61 + uVar111;
  iVar85 = iVar82 + uVar114;
  iVar48 = uVar101 - iVar48;
  iVar52 = uVar108 - iVar52;
  iVar61 = uVar111 - iVar61;
  iVar82 = uVar114 - iVar82;
  uVar101 = (uint)(iVar113 < iVar4) * iVar4 | (uint)(iVar113 >= iVar4) * iVar113;
  uVar108 = (uint)(iVar56 < iVar4) * iVar4 | (uint)(iVar56 >= iVar4) * iVar56;
  uVar111 = (uint)(iVar59 < iVar4) * iVar4 | (uint)(iVar59 >= iVar4) * iVar59;
  uVar114 = (uint)(iVar62 < iVar4) * iVar4 | (uint)(iVar62 >= iVar4) * iVar62;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  iVar90 = (iVar8 - auVar11._0_4_) + auVar17._0_4_ >> auVar44;
  iVar29 = (iVar8 - auVar11._4_4_) + auVar17._4_4_ >> auVar44;
  iVar20 = (iVar8 - auVar11._8_4_) + auVar17._8_4_ >> auVar44;
  iVar30 = (iVar8 - auVar11._12_4_) + auVar17._12_4_ >> auVar44;
  iVar23 = iVar90 + uVar101;
  iVar42 = iVar29 + uVar108;
  iVar72 = iVar20 + uVar111;
  iVar15 = iVar30 + uVar114;
  iVar90 = uVar101 - iVar90;
  iVar29 = uVar108 - iVar29;
  iVar20 = uVar111 - iVar20;
  iVar30 = uVar114 - iVar30;
  uVar101 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar108 = (uint)(iVar96 < iVar4) * iVar4 | (uint)(iVar96 >= iVar4) * iVar96;
  uVar114 = (uint)(iVar19 < iVar4) * iVar4 | (uint)(iVar19 >= iVar4) * iVar19;
  uVar67 = (uint)(iVar21 < iVar4) * iVar4 | (uint)(iVar21 >= iVar4) * iVar21;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar111 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar63 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar70 = (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  uVar108 = (uint)(iVar49 < iVar4) * iVar4 | (uint)(iVar49 >= iVar4) * iVar49;
  uVar114 = (uint)(iVar50 < iVar4) * iVar4 | (uint)(iVar50 >= iVar4) * iVar50;
  uVar67 = (uint)(iVar87 < iVar4) * iVar4 | (uint)(iVar87 >= iVar4) * iVar87;
  uVar73 = (uint)(iVar97 < iVar4) * iVar4 | (uint)(iVar97 >= iVar4) * iVar97;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar67 = (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  uVar73 = (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  iVar49 = uVar108 + uVar101;
  iVar56 = uVar114 + uVar111;
  iVar75 = uVar67 + uVar63;
  iVar84 = uVar73 + uVar70;
  iVar27 = uVar108 - uVar101;
  iVar96 = uVar114 - uVar111;
  iVar21 = uVar67 - uVar63;
  iVar32 = uVar73 - uVar70;
  uVar101 = (uint)(iVar116 < iVar4) * iVar4 | (uint)(iVar116 >= iVar4) * iVar116;
  uVar108 = (uint)(iVar122 < iVar4) * iVar4 | (uint)(iVar122 >= iVar4) * iVar122;
  uVar111 = (uint)(iVar123 < iVar4) * iVar4 | (uint)(iVar123 >= iVar4) * iVar123;
  uVar114 = (uint)(iVar124 < iVar4) * iVar4 | (uint)(iVar124 >= iVar4) * iVar124;
  auVar121._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar121._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar121._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar121._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar102 < iVar4) * iVar4 | (uint)(iVar102 >= iVar4) * iVar102;
  uVar108 = (uint)(iVar109 < iVar4) * iVar4 | (uint)(iVar109 >= iVar4) * iVar109;
  uVar111 = (uint)(iVar112 < iVar4) * iVar4 | (uint)(iVar112 >= iVar4) * iVar112;
  uVar114 = (uint)(iVar115 < iVar4) * iVar4 | (uint)(iVar115 >= iVar4) * iVar115;
  auVar105._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar105._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar105._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar105._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  auVar17 = pmulld(auVar121,local_108);
  auVar24 = pmulld(auVar105,local_108);
  uVar101 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar108 = (uint)(iVar10 < iVar4) * iVar4 | (uint)(iVar10 >= iVar4) * iVar10;
  uVar111 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  uVar114 = (uint)(iVar13 < iVar4) * iVar4 | (uint)(iVar13 >= iVar4) * iVar13;
  auVar106._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar106._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar106._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar106._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar33 < iVar4) * iVar4 | (uint)(iVar33 >= iVar4) * iVar33;
  uVar108 = (uint)(iVar58 < iVar4) * iVar4 | (uint)(iVar58 >= iVar4) * iVar58;
  uVar111 = (uint)(iVar80 < iVar4) * iVar4 | (uint)(iVar80 >= iVar4) * iVar80;
  uVar114 = (uint)(iVar107 < iVar4) * iVar4 | (uint)(iVar107 >= iVar4) * iVar107;
  auVar45._0_4_ = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  auVar45._4_4_ = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  auVar45._8_4_ = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  auVar45._12_4_ = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  auVar16 = pmulld(auVar106,local_108);
  auVar11 = pmulld(auVar45,local_108);
  iVar59 = (iVar8 - auVar17._0_4_) + auVar24._0_4_ >> auVar44;
  iVar62 = (iVar8 - auVar17._4_4_) + auVar24._4_4_ >> auVar44;
  iVar98 = (iVar8 - auVar17._8_4_) + auVar24._8_4_ >> auVar44;
  iVar102 = (iVar8 - auVar17._12_4_) + auVar24._12_4_ >> auVar44;
  iVar5 = auVar17._0_4_ + iVar8 + auVar24._0_4_ >> auVar44;
  iVar10 = auVar17._4_4_ + iVar8 + auVar24._4_4_ >> auVar44;
  iVar12 = auVar17._8_4_ + iVar8 + auVar24._8_4_ >> auVar44;
  iVar13 = auVar17._12_4_ + iVar8 + auVar24._12_4_ >> auVar44;
  iVar93 = (iVar8 - auVar16._0_4_) + auVar11._0_4_ >> auVar44;
  iVar19 = (iVar8 - auVar16._4_4_) + auVar11._4_4_ >> auVar44;
  iVar22 = (iVar8 - auVar16._8_4_) + auVar11._8_4_ >> auVar44;
  iVar33 = (iVar8 - auVar16._12_4_) + auVar11._12_4_ >> auVar44;
  iVar50 = auVar16._0_4_ + iVar8 + auVar11._0_4_ >> auVar44;
  iVar58 = auVar16._4_4_ + iVar8 + auVar11._4_4_ >> auVar44;
  iVar80 = auVar16._8_4_ + iVar8 + auVar11._8_4_ >> auVar44;
  iVar87 = auVar16._12_4_ + iVar8 + auVar11._12_4_ >> auVar44;
  uVar101 = (uint)(iVar64 < iVar4) * iVar4 | (uint)(iVar64 >= iVar4) * iVar64;
  uVar108 = (uint)(iVar68 < iVar4) * iVar4 | (uint)(iVar68 >= iVar4) * iVar68;
  uVar111 = (uint)(iVar71 < iVar4) * iVar4 | (uint)(iVar71 >= iVar4) * iVar71;
  uVar114 = (uint)(iVar74 < iVar4) * iVar4 | (uint)(iVar74 >= iVar4) * iVar74;
  uVar63 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar67 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar70 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar73 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar60 < iVar4) * iVar4 | (uint)(iVar60 >= iVar4) * iVar60;
  uVar108 = (uint)(iVar38 < iVar4) * iVar4 | (uint)(iVar38 >= iVar4) * iVar38;
  uVar111 = (uint)(iVar39 < iVar4) * iVar4 | (uint)(iVar39 >= iVar4) * iVar39;
  uVar114 = (uint)(iVar46 < iVar4) * iVar4 | (uint)(iVar46 >= iVar4) * iVar46;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  iVar46 = uVar101 + uVar63;
  iVar97 = uVar108 + uVar67;
  iVar107 = uVar111 + uVar70;
  iVar113 = uVar114 + uVar73;
  iVar8 = uVar101 - uVar63;
  iVar60 = uVar108 - uVar67;
  iVar38 = uVar111 - uVar70;
  iVar39 = uVar114 - uVar73;
  uVar101 = (uint)(iVar46 < iVar4) * iVar4 | (uint)(iVar46 >= iVar4) * iVar46;
  uVar108 = (uint)(iVar97 < iVar4) * iVar4 | (uint)(iVar97 >= iVar4) * iVar97;
  uVar111 = (uint)(iVar107 < iVar4) * iVar4 | (uint)(iVar107 >= iVar4) * iVar107;
  uVar114 = (uint)(iVar113 < iVar4) * iVar4 | (uint)(iVar113 >= iVar4) * iVar113;
  *(uint *)*out = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)*out + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(*out + 1) = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar8 < iVar4) * iVar4 | (uint)(iVar8 >= iVar4) * iVar8;
  uVar108 = (uint)(iVar60 < iVar4) * iVar4 | (uint)(iVar60 >= iVar4) * iVar60;
  uVar111 = (uint)(iVar38 < iVar4) * iVar4 | (uint)(iVar38 >= iVar4) * iVar38;
  uVar114 = (uint)(iVar39 < iVar4) * iVar4 | (uint)(iVar39 >= iVar4) * iVar39;
  *(uint *)out[0xf] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[0xf] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar108 = (uint)(iVar9 < iVar4) * iVar4 | (uint)(iVar9 >= iVar4) * iVar9;
  uVar111 = (uint)(iVar43 < iVar4) * iVar4 | (uint)(iVar43 >= iVar4) * iVar43;
  uVar114 = (uint)(iVar86 < iVar4) * iVar4 | (uint)(iVar86 >= iVar4) * iVar86;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar63 = (uint)(iVar76 < iVar4) * iVar4 | (uint)(iVar76 >= iVar4) * iVar76;
  uVar67 = (uint)(iVar81 < iVar4) * iVar4 | (uint)(iVar81 >= iVar4) * iVar81;
  uVar70 = (uint)(iVar83 < iVar4) * iVar4 | (uint)(iVar83 >= iVar4) * iVar83;
  uVar73 = (uint)(iVar85 < iVar4) * iVar4 | (uint)(iVar85 >= iVar4) * iVar85;
  uVar63 = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  uVar67 = (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  uVar70 = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
  uVar73 = (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  iVar7 = uVar63 + uVar101;
  iVar8 = uVar67 + uVar108;
  iVar9 = uVar70 + uVar111;
  iVar43 = uVar73 + uVar114;
  iVar86 = uVar63 - uVar101;
  iVar60 = uVar67 - uVar108;
  iVar38 = uVar70 - uVar111;
  iVar39 = uVar73 - uVar114;
  uVar101 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar108 = (uint)(iVar8 < iVar4) * iVar4 | (uint)(iVar8 >= iVar4) * iVar8;
  uVar111 = (uint)(iVar9 < iVar4) * iVar4 | (uint)(iVar9 >= iVar4) * iVar9;
  uVar114 = (uint)(iVar43 < iVar4) * iVar4 | (uint)(iVar43 >= iVar4) * iVar43;
  *(uint *)out[1] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[1] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar23 < iVar4) * iVar4 | (uint)(iVar23 >= iVar4) * iVar23;
  uVar108 = (uint)(iVar42 < iVar4) * iVar4 | (uint)(iVar42 >= iVar4) * iVar42;
  uVar111 = (uint)(iVar72 < iVar4) * iVar4 | (uint)(iVar72 >= iVar4) * iVar72;
  uVar114 = (uint)(iVar15 < iVar4) * iVar4 | (uint)(iVar15 >= iVar4) * iVar15;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar63 = (uint)(iVar86 < iVar4) * iVar4 | (uint)(iVar86 >= iVar4) * iVar86;
  uVar67 = (uint)(iVar60 < iVar4) * iVar4 | (uint)(iVar60 >= iVar4) * iVar60;
  uVar70 = (uint)(iVar38 < iVar4) * iVar4 | (uint)(iVar38 >= iVar4) * iVar38;
  uVar73 = (uint)(iVar39 < iVar4) * iVar4 | (uint)(iVar39 >= iVar4) * iVar39;
  *(uint *)out[0xe] = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  *(uint *)(out[0xe] + 1) = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70
  ;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  iVar23 = iVar5 + uVar101;
  iVar7 = iVar10 + uVar108;
  iVar8 = iVar12 + uVar111;
  iVar9 = iVar13 + uVar114;
  iVar5 = uVar101 - iVar5;
  iVar10 = uVar108 - iVar10;
  iVar12 = uVar111 - iVar12;
  iVar13 = uVar114 - iVar13;
  uVar101 = (uint)(iVar23 < iVar4) * iVar4 | (uint)(iVar23 >= iVar4) * iVar23;
  uVar108 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar111 = (uint)(iVar8 < iVar4) * iVar4 | (uint)(iVar8 >= iVar4) * iVar8;
  uVar114 = (uint)(iVar9 < iVar4) * iVar4 | (uint)(iVar9 >= iVar4) * iVar9;
  *(uint *)out[2] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[2] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar49 < iVar4) * iVar4 | (uint)(iVar49 >= iVar4) * iVar49;
  uVar108 = (uint)(iVar56 < iVar4) * iVar4 | (uint)(iVar56 >= iVar4) * iVar56;
  uVar111 = (uint)(iVar75 < iVar4) * iVar4 | (uint)(iVar75 >= iVar4) * iVar75;
  uVar114 = (uint)(iVar84 < iVar4) * iVar4 | (uint)(iVar84 >= iVar4) * iVar84;
  uVar63 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar67 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar70 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar73 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar108 = (uint)(iVar10 < iVar4) * iVar4 | (uint)(iVar10 >= iVar4) * iVar10;
  uVar111 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  uVar114 = (uint)(iVar13 < iVar4) * iVar4 | (uint)(iVar13 >= iVar4) * iVar13;
  *(uint *)out[0xd] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[0xd] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  iVar23 = iVar50 + uVar63;
  iVar5 = iVar58 + uVar67;
  iVar7 = iVar80 + uVar70;
  iVar8 = iVar87 + uVar73;
  iVar50 = uVar63 - iVar50;
  iVar58 = uVar67 - iVar58;
  iVar80 = uVar70 - iVar80;
  iVar87 = uVar73 - iVar87;
  uVar101 = (uint)(iVar23 < iVar4) * iVar4 | (uint)(iVar23 >= iVar4) * iVar23;
  uVar108 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar111 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar114 = (uint)(iVar8 < iVar4) * iVar4 | (uint)(iVar8 >= iVar4) * iVar8;
  *(uint *)out[3] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[3] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar108 = (uint)(iVar96 < iVar4) * iVar4 | (uint)(iVar96 >= iVar4) * iVar96;
  uVar111 = (uint)(iVar21 < iVar4) * iVar4 | (uint)(iVar21 >= iVar4) * iVar21;
  uVar114 = (uint)(iVar32 < iVar4) * iVar4 | (uint)(iVar32 >= iVar4) * iVar32;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar63 = (uint)(iVar50 < iVar4) * iVar4 | (uint)(iVar50 >= iVar4) * iVar50;
  uVar67 = (uint)(iVar58 < iVar4) * iVar4 | (uint)(iVar58 >= iVar4) * iVar58;
  uVar70 = (uint)(iVar80 < iVar4) * iVar4 | (uint)(iVar80 >= iVar4) * iVar80;
  uVar73 = (uint)(iVar87 < iVar4) * iVar4 | (uint)(iVar87 >= iVar4) * iVar87;
  *(uint *)out[0xc] = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  *(uint *)(out[0xc] + 1) = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70
  ;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  iVar23 = iVar93 + uVar101;
  iVar5 = iVar19 + uVar108;
  iVar7 = iVar22 + uVar111;
  iVar8 = iVar33 + uVar114;
  iVar93 = uVar101 - iVar93;
  iVar19 = uVar108 - iVar19;
  iVar22 = uVar111 - iVar22;
  iVar33 = uVar114 - iVar33;
  uVar101 = (uint)(iVar23 < iVar4) * iVar4 | (uint)(iVar23 >= iVar4) * iVar23;
  uVar108 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar111 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar114 = (uint)(iVar8 < iVar4) * iVar4 | (uint)(iVar8 >= iVar4) * iVar8;
  *(uint *)out[4] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[4] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar90 < iVar4) * iVar4 | (uint)(iVar90 >= iVar4) * iVar90;
  uVar108 = (uint)(iVar29 < iVar4) * iVar4 | (uint)(iVar29 >= iVar4) * iVar29;
  uVar111 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  uVar114 = (uint)(iVar30 < iVar4) * iVar4 | (uint)(iVar30 >= iVar4) * iVar30;
  uVar63 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar67 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar70 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar73 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar93 < iVar4) * iVar4 | (uint)(iVar93 >= iVar4) * iVar93;
  uVar108 = (uint)(iVar19 < iVar4) * iVar4 | (uint)(iVar19 >= iVar4) * iVar19;
  uVar111 = (uint)(iVar22 < iVar4) * iVar4 | (uint)(iVar22 >= iVar4) * iVar22;
  uVar114 = (uint)(iVar33 < iVar4) * iVar4 | (uint)(iVar33 >= iVar4) * iVar33;
  *(uint *)out[0xb] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[0xb] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  iVar23 = uVar63 + iVar59;
  iVar5 = uVar67 + iVar62;
  iVar7 = uVar70 + iVar98;
  iVar8 = uVar73 + iVar102;
  iVar59 = uVar63 - iVar59;
  iVar62 = uVar67 - iVar62;
  iVar98 = uVar70 - iVar98;
  iVar102 = uVar73 - iVar102;
  uVar101 = (uint)(iVar23 < iVar4) * iVar4 | (uint)(iVar23 >= iVar4) * iVar23;
  uVar108 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar111 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar114 = (uint)(iVar8 < iVar4) * iVar4 | (uint)(iVar8 >= iVar4) * iVar8;
  *(uint *)out[5] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[5] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar3 < iVar4) * iVar4 | (uint)(iVar3 >= iVar4) * iVar3;
  uVar108 = (uint)(iVar66 < iVar4) * iVar4 | (uint)(iVar66 >= iVar4) * iVar66;
  uVar111 = (uint)(iVar69 < iVar4) * iVar4 | (uint)(iVar69 >= iVar4) * iVar69;
  uVar114 = (uint)(iVar14 < iVar4) * iVar4 | (uint)(iVar14 >= iVar4) * iVar14;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar63 = (uint)(iVar48 < iVar4) * iVar4 | (uint)(iVar48 >= iVar4) * iVar48;
  uVar67 = (uint)(iVar52 < iVar4) * iVar4 | (uint)(iVar52 >= iVar4) * iVar52;
  uVar70 = (uint)(iVar61 < iVar4) * iVar4 | (uint)(iVar61 >= iVar4) * iVar61;
  uVar73 = (uint)(iVar82 < iVar4) * iVar4 | (uint)(iVar82 >= iVar4) * iVar82;
  uVar88 = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  uVar92 = (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  uVar95 = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
  uVar99 = (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  uVar63 = (uint)(iVar59 < iVar4) * iVar4 | (uint)(iVar59 >= iVar4) * iVar59;
  uVar67 = (uint)(iVar62 < iVar4) * iVar4 | (uint)(iVar62 >= iVar4) * iVar62;
  uVar70 = (uint)(iVar98 < iVar4) * iVar4 | (uint)(iVar98 >= iVar4) * iVar98;
  uVar73 = (uint)(iVar102 < iVar4) * iVar4 | (uint)(iVar102 >= iVar4) * iVar102;
  *(uint *)out[10] = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  *(uint *)(out[10] + 1) = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  iVar23 = uVar88 + uVar101;
  iVar5 = uVar92 + uVar108;
  iVar3 = uVar95 + uVar111;
  iVar7 = uVar99 + uVar114;
  iVar8 = uVar88 - uVar101;
  iVar9 = uVar92 - uVar108;
  iVar10 = uVar95 - uVar111;
  iVar66 = uVar99 - uVar114;
  uVar101 = (uint)(iVar23 < iVar4) * iVar4 | (uint)(iVar23 >= iVar4) * iVar23;
  uVar108 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar111 = (uint)(iVar3 < iVar4) * iVar4 | (uint)(iVar3 >= iVar4) * iVar3;
  uVar114 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  *(uint *)out[6] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[6] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar101 = (uint)(iVar91 < iVar4) * iVar4 | (uint)(iVar91 >= iVar4) * iVar91;
  uVar108 = (uint)(iVar94 < iVar4) * iVar4 | (uint)(iVar94 >= iVar4) * iVar94;
  uVar111 = (uint)(iVar100 < iVar4) * iVar4 | (uint)(iVar100 >= iVar4) * iVar100;
  uVar114 = (uint)(iVar110 < iVar4) * iVar4 | (uint)(iVar110 >= iVar4) * iVar110;
  uVar101 = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  uVar108 = (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  uVar111 = (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  uVar114 = (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  uVar63 = (uint)(iVar34 < iVar4) * iVar4 | (uint)(iVar34 >= iVar4) * iVar34;
  uVar67 = (uint)(iVar51 < iVar4) * iVar4 | (uint)(iVar51 >= iVar4) * iVar51;
  uVar70 = (uint)(iVar55 < iVar4) * iVar4 | (uint)(iVar55 >= iVar4) * iVar55;
  uVar73 = (uint)(iVar57 < iVar4) * iVar4 | (uint)(iVar57 >= iVar4) * iVar57;
  uVar63 = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  uVar67 = (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  uVar70 = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
  uVar73 = (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  uVar88 = (uint)(iVar8 < iVar4) * iVar4 | (uint)(iVar8 >= iVar4) * iVar8;
  uVar92 = (uint)(iVar9 < iVar4) * iVar4 | (uint)(iVar9 >= iVar4) * iVar9;
  uVar95 = (uint)(iVar10 < iVar4) * iVar4 | (uint)(iVar10 >= iVar4) * iVar10;
  uVar99 = (uint)(iVar66 < iVar4) * iVar4 | (uint)(iVar66 >= iVar4) * iVar66;
  *(uint *)out[9] = (uint)(iVar26 < (int)uVar88) * iVar26 | (iVar26 >= (int)uVar88) * uVar88;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar26 < (int)uVar92) * iVar26 | (iVar26 >= (int)uVar92) * uVar92;
  *(uint *)(out[9] + 1) = (uint)(iVar26 < (int)uVar95) * iVar26 | (iVar26 >= (int)uVar95) * uVar95;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar26 < (int)uVar99) * iVar26 | (iVar26 >= (int)uVar99) * uVar99;
  iVar23 = uVar63 + uVar101;
  iVar5 = uVar67 + uVar108;
  iVar3 = uVar70 + uVar111;
  iVar7 = uVar73 + uVar114;
  iVar8 = uVar63 - uVar101;
  iVar9 = uVar67 - uVar108;
  iVar10 = uVar70 - uVar111;
  iVar66 = uVar73 - uVar114;
  uVar101 = (uint)(iVar23 < iVar4) * iVar4 | (uint)(iVar23 >= iVar4) * iVar23;
  uVar108 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar111 = (uint)(iVar3 < iVar4) * iVar4 | (uint)(iVar3 >= iVar4) * iVar3;
  uVar114 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar63 = (uint)(iVar8 < iVar4) * iVar4 | (uint)(iVar8 >= iVar4) * iVar8;
  uVar67 = (uint)(iVar9 < iVar4) * iVar4 | (uint)(iVar9 >= iVar4) * iVar9;
  uVar70 = (uint)(iVar10 < iVar4) * iVar4 | (uint)(iVar10 >= iVar4) * iVar10;
  uVar73 = (uint)(iVar66 < iVar4) * iVar4 | (uint)(iVar66 >= iVar4) * iVar66;
  *(uint *)out[7] = (uint)(iVar26 < (int)uVar101) * iVar26 | (iVar26 >= (int)uVar101) * uVar101;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar26 < (int)uVar108) * iVar26 | (iVar26 >= (int)uVar108) * uVar108;
  *(uint *)(out[7] + 1) =
       (uint)(iVar26 < (int)uVar111) * iVar26 | (iVar26 >= (int)uVar111) * uVar111;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar26 < (int)uVar114) * iVar26 | (iVar26 >= (int)uVar114) * uVar114;
  *(uint *)out[8] = (uint)(iVar26 < (int)uVar63) * iVar26 | (iVar26 >= (int)uVar63) * uVar63;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar26 < (int)uVar67) * iVar26 | (iVar26 >= (int)uVar67) * uVar67;
  *(uint *)(out[8] + 1) = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
  if (do_cols == 0) {
    bVar2 = 10;
    if (10 < bd) {
      bVar2 = (byte)bd;
    }
    iVar23 = 0x20 << (bVar2 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar23;
    clamp_hi_out[0]._0_4_ = iVar23 + -1;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    round_shift_8x8(out,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,&clamp_lo_out,&clamp_hi_out,0x10);
  }
  return;
}

Assistant:

static void idct16x16_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[16], v[16], x, y;

  {
    // stage 0
    // stage 1
    u[0] = in[0];
    u[1] = in[8];
    u[2] = in[4];
    u[3] = in[12];
    u[4] = in[2];
    u[5] = in[10];
    u[6] = in[6];
    u[7] = in[14];
    u[8] = in[1];
    u[9] = in[9];
    u[10] = in[5];
    u[11] = in[13];
    u[12] = in[3];
    u[13] = in[11];
    u[14] = in[7];
    u[15] = in[15];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];

    v[8] = half_btf_sse4_1(&cospi60, &u[8], &cospim4, &u[15], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi28, &u[9], &cospim36, &u[14], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi44, &u[10], &cospim20, &u[13], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi12, &u[11], &cospim52, &u[12], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospi52, &u[11], &cospi12, &u[12], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi20, &u[10], &cospi44, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi36, &u[9], &cospi28, &u[14], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi4, &u[8], &cospi60, &u[15], &rnding, bit);

    // stage 3
    u[0] = v[0];
    u[1] = v[1];
    u[2] = v[2];
    u[3] = v[3];
    u[4] = half_btf_sse4_1(&cospi56, &v[4], &cospim8, &v[7], &rnding, bit);
    u[5] = half_btf_sse4_1(&cospi24, &v[5], &cospim40, &v[6], &rnding, bit);
    u[6] = half_btf_sse4_1(&cospi40, &v[5], &cospi24, &v[6], &rnding, bit);
    u[7] = half_btf_sse4_1(&cospi8, &v[4], &cospi56, &v[7], &rnding, bit);
    addsub_sse4_1(v[8], v[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[11], v[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[12], v[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[15], v[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

    // stage 4
    x = _mm_mullo_epi32(u[0], cospi32);
    y = _mm_mullo_epi32(u[1], cospi32);
    v[0] = _mm_add_epi32(x, y);
    v[0] = _mm_add_epi32(v[0], rnding);
    v[0] = _mm_srai_epi32(v[0], bit);

    v[1] = _mm_sub_epi32(x, y);
    v[1] = _mm_add_epi32(v[1], rnding);
    v[1] = _mm_srai_epi32(v[1], bit);

    v[2] = half_btf_sse4_1(&cospi48, &u[2], &cospim16, &u[3], &rnding, bit);
    v[3] = half_btf_sse4_1(&cospi16, &u[2], &cospi48, &u[3], &rnding, bit);
    addsub_sse4_1(u[4], u[5], &v[4], &v[5], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[7], u[6], &v[7], &v[6], &clamp_lo, &clamp_hi);
    v[8] = u[8];
    v[9] = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    v[11] = u[11];
    v[12] = u[12];
    v[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    v[15] = u[15];

    // stage 5
    addsub_sse4_1(v[0], v[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[1], v[2], &u[1], &u[2], &clamp_lo, &clamp_hi);
    u[4] = v[4];

    x = _mm_mullo_epi32(v[5], cospi32);
    y = _mm_mullo_epi32(v[6], cospi32);
    u[5] = _mm_sub_epi32(y, x);
    u[5] = _mm_add_epi32(u[5], rnding);
    u[5] = _mm_srai_epi32(u[5], bit);

    u[6] = _mm_add_epi32(y, x);
    u[6] = _mm_add_epi32(u[6], rnding);
    u[6] = _mm_srai_epi32(u[6], bit);

    u[7] = v[7];
    addsub_sse4_1(v[8], v[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[9], v[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[15], v[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[14], v[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    // stage 6
    addsub_sse4_1(u[0], u[7], &v[0], &v[7], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[1], u[6], &v[1], &v[6], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[2], u[5], &v[2], &v[5], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[3], u[4], &v[3], &v[4], &clamp_lo, &clamp_hi);
    v[8] = u[8];
    v[9] = u[9];

    x = _mm_mullo_epi32(u[10], cospi32);
    y = _mm_mullo_epi32(u[13], cospi32);
    v[10] = _mm_sub_epi32(y, x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_add_epi32(x, y);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    x = _mm_mullo_epi32(u[11], cospi32);
    y = _mm_mullo_epi32(u[12], cospi32);
    v[11] = _mm_sub_epi32(y, x);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = _mm_add_epi32(x, y);
    v[12] = _mm_add_epi32(v[12], rnding);
    v[12] = _mm_srai_epi32(v[12], bit);

    v[14] = u[14];
    v[15] = u[15];

    // stage 7
    addsub_sse4_1(v[0], v[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[1], v[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[2], v[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[3], v[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[4], v[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[5], v[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[6], v[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[7], v[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
      const __m128i clamp_hi_out =
          _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
      round_shift_8x8(out, out_shift);
      highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
    }
  }
}